

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

int InitThreadContext(VP8Decoder *dec)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  VP8Decoder *in_RDI;
  WebPWorker *worker;
  
  in_RDI->cache_id_ = 0;
  if (in_RDI->mt_method_ < 1) {
    in_RDI->num_caches_ = 1;
  }
  else {
    pWVar2 = WebPGetWorkerInterface();
    iVar1 = (*pWVar2->Reset)(&in_RDI->worker_);
    if (iVar1 == 0) {
      iVar1 = VP8SetError(in_RDI,VP8_STATUS_OUT_OF_MEMORY,"thread initialization failed.");
      return iVar1;
    }
    (in_RDI->worker_).data1 = in_RDI;
    (in_RDI->worker_).data2 = &(in_RDI->thread_ctx_).io_;
    (in_RDI->worker_).hook = FinishRow;
    iVar1 = 2;
    if (0 < in_RDI->filter_type_) {
      iVar1 = 3;
    }
    in_RDI->num_caches_ = iVar1;
  }
  return 1;
}

Assistant:

static int InitThreadContext(VP8Decoder* const dec) {
  dec->cache_id_ = 0;
  if (dec->mt_method_ > 0) {
    WebPWorker* const worker = &dec->worker_;
    if (!WebPGetWorkerInterface()->Reset(worker)) {
      return VP8SetError(dec, VP8_STATUS_OUT_OF_MEMORY,
                         "thread initialization failed.");
    }
    worker->data1 = dec;
    worker->data2 = (void*)&dec->thread_ctx_.io_;
    worker->hook = FinishRow;
    dec->num_caches_ =
      (dec->filter_type_ > 0) ? MT_CACHE_LINES : MT_CACHE_LINES - 1;
  } else {
    dec->num_caches_ = ST_CACHE_LINES;
  }
  return 1;
}